

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Vec3_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  int err;
  ulong uVar5;
  double dVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  uint64_t value;
  int8_t local_51;
  double local_50;
  undefined4 *local_48;
  int local_40;
  int local_3c;
  void *local_38;
  
  local_48 = (undefined4 *)struct_base;
  if ((buf == end) || (*buf != '{')) {
    pcVar4 = flatcc_json_parser_set_error(ctx,buf,end,0x15);
    return pcVar4;
  }
  puVar8 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar8 < 2) {
LAB_0010f879:
    puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
  }
  else if ((char)(byte)*puVar8 < '!') {
    if (((byte)*puVar8 != 0x20) || (buf[2] < '!')) goto LAB_0010f879;
    puVar8 = (ulong *)(buf + 2);
  }
  if ((puVar8 == (ulong *)end) || ((byte)*puVar8 != 0x7d)) {
    local_3c = 1;
    local_38 = (void *)((long)local_48 + 0x1a);
    puVar13 = puVar8;
    do {
      if (puVar13 != (ulong *)end) {
        if ((byte)*puVar13 == 0x2e) {
          puVar13 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar13,end,5);
        }
        else if ((byte)*puVar13 == 0x22) {
          puVar13 = (ulong *)((long)puVar13 + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar5 = (long)end - (long)puVar13;
      puVar8 = puVar13;
      if (uVar5 < 8) {
        uVar7 = 0;
        uVar3 = 0;
        uVar9 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar2 = 0;
        switch(uVar5) {
        case 7:
          uVar7 = (long)(char)*(byte *)((long)puVar13 + 6) << 8;
        case 6:
          uVar3 = (long)(char)*(byte *)((long)puVar13 + 5) << 0x10 | uVar7;
        case 5:
          uVar9 = (long)(char)*(byte *)((long)puVar13 + 4) << 0x18 | uVar3;
        case 4:
          uVar11 = (long)(char)*(byte *)((long)puVar13 + 3) << 0x20 | uVar9;
        case 3:
          uVar12 = (long)(char)*(byte *)((long)puVar13 + 2) << 0x28 | uVar11;
        case 2:
          uVar2 = (long)(char)*(byte *)((long)puVar13 + 1) << 0x30 | uVar12;
        case 1:
          uVar2 = (ulong)(byte)*puVar13 << 0x38 | uVar2;
          goto LAB_0010f9b4;
        }
switchD_0010f960_default:
        puVar13 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar8,end);
      }
      else {
        uVar3 = *puVar13;
        uVar2 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
LAB_0010f9b4:
        if (uVar2 < 0x7465737433000000) {
          if ((uVar2 & 0x7fffffffff000000) == 0x7465737431000000) {
            if (5 < (long)uVar5) {
              bVar1 = *(byte *)((long)puVar13 + 5);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar10 = (byte *)((long)puVar13 + 6);
                  goto LAB_0010fc1e;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar10 = (byte *)((long)puVar13 + 5);
                ctx->unquoted = 0;
LAB_0010fc1e:
                if ((long)end - (long)pbVar10 < 2) {
LAB_0010fca7:
                  pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
                }
                else if ((char)*pbVar10 < '!') {
                  if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_0010fca7;
                  pbVar10 = pbVar10 + 1;
                }
                if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                  puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
                }
                else {
                  puVar8 = (ulong *)(pbVar10 + 1);
                  if ((long)end - (long)puVar8 < 2) {
LAB_0010ff1f:
                    puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                  }
                  else if ((char)(byte)*puVar8 < '!') {
                    if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_0010ff1f;
                    puVar8 = (ulong *)(pbVar10 + 2);
                  }
                }
              }
            }
            if (puVar13 == puVar8) goto switchD_0010f960_default;
            local_50 = 0.0;
            puVar13 = (ulong *)flatcc_json_parser_double(ctx,(char *)puVar8,end,&local_50);
            if ((puVar8 == puVar13) &&
               ((puVar13 = (ulong *)flatcc_json_parser_symbolic_double
                                              (ctx,(char *)puVar13,end,
                                               MyGame_Example_Vec3_parse_json_struct_inline::
                                               symbolic_parsers_1,&local_50), puVar13 == puVar8 ||
                (puVar13 == (ulong *)end)))) {
LAB_001102bf:
              pcVar4 = flatcc_json_parser_set_error(ctx,(char *)puVar13,end,0x23);
              return pcVar4;
            }
            *(double *)(local_48 + 4) = local_50;
          }
          else {
            if ((uVar2 & 0x7fffffffff000000) != 0x7465737432000000) goto switchD_0010f960_default;
            if (5 < (long)uVar5) {
              bVar1 = *(byte *)((long)puVar13 + 5);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar10 = (byte *)((long)puVar13 + 6);
                  goto LAB_0010fbf1;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar10 = (byte *)((long)puVar13 + 5);
                ctx->unquoted = 0;
LAB_0010fbf1:
                if ((long)end - (long)pbVar10 < 2) {
LAB_0010fc40:
                  pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
                }
                else if ((char)*pbVar10 < '!') {
                  if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_0010fc40;
                  pbVar10 = pbVar10 + 1;
                }
                if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                  puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
                }
                else {
                  puVar8 = (ulong *)(pbVar10 + 1);
                  if ((long)end - (long)puVar8 < 2) {
LAB_0010fe3e:
                    puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                  }
                  else if ((char)(byte)*puVar8 < '!') {
                    if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_0010fe3e;
                    puVar8 = (ulong *)(pbVar10 + 2);
                  }
                }
              }
            }
            if (puVar13 == puVar8) goto switchD_0010f960_default;
            local_50 = 0.0;
            local_40 = 0;
            local_51 = '\0';
            puVar13 = puVar8;
            if ((puVar8 != (ulong *)end) &&
               (puVar13 = (ulong *)flatcc_json_parser_integer
                                             (ctx,(char *)puVar8,end,&local_40,(uint64_t *)&local_50
                                             ), puVar13 != puVar8)) {
              if (local_40 == 0) {
                dVar6 = local_50;
                if ((ulong)local_50 < 0x80) goto LAB_0010fed9;
                err = 7;
              }
              else {
                if ((ulong)local_50 < 0x81) {
                  dVar6 = (double)-(long)local_50;
LAB_0010fed9:
                  local_51 = SUB81(dVar6,0);
                  goto LAB_0010fedd;
                }
                err = 8;
              }
              puVar13 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar13,end,err);
            }
LAB_0010fedd:
            if ((puVar8 == puVar13) &&
               ((puVar13 = (ulong *)flatcc_json_parser_symbolic_int8
                                              (ctx,(char *)puVar13,end,
                                               MyGame_Example_Vec3_parse_json_struct_inline::
                                               symbolic_parsers,&local_51), puVar13 == puVar8 ||
                (puVar13 == (ulong *)end)))) goto LAB_001102bf;
            *(int8_t *)(local_48 + 6) = local_51;
          }
        }
        else if ((uint)(uVar2 >> 0x3b) < 0xf) {
          if ((uVar2 & 0x7fffffffff000000) != 0x7465737433000000) goto switchD_0010f960_default;
          if (5 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar13 + 5);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar10 = (byte *)((long)puVar13 + 6);
                goto LAB_0010fd1e;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar10 = (byte *)((long)puVar13 + 5);
              ctx->unquoted = 0;
LAB_0010fd1e:
              if ((long)end - (long)pbVar10 < 2) {
LAB_0010fd69:
                pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
              }
              else if ((char)*pbVar10 < '!') {
                if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_0010fd69;
                pbVar10 = pbVar10 + 1;
              }
              if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
              }
              else {
                puVar8 = (ulong *)(pbVar10 + 1);
                if ((long)end - (long)puVar8 < 2) {
LAB_001100c8:
                  puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                }
                else if ((char)(byte)*puVar8 < '!') {
                  if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_001100c8;
                  puVar8 = (ulong *)(pbVar10 + 2);
                }
              }
            }
          }
          if (puVar13 == puVar8) goto switchD_0010f960_default;
          puVar13 = (ulong *)MyGame_Example_Test_parse_json_struct_inline
                                       (ctx,(char *)puVar8,end,local_38);
        }
        else if ((byte)(uVar2 >> 0x38) < 0x79) {
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar13 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar10 = (byte *)((long)puVar13 + 2);
                goto LAB_0010fd4b;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar10 = (byte *)((long)puVar13 + 1);
              ctx->unquoted = 0;
LAB_0010fd4b:
              if ((long)end - (long)pbVar10 < 2) {
LAB_0010fdc2:
                pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
              }
              else if ((char)*pbVar10 < '!') {
                if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_0010fdc2;
                pbVar10 = pbVar10 + 1;
              }
              if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
              }
              else {
                puVar8 = (ulong *)(pbVar10 + 1);
                if ((long)end - (long)puVar8 < 2) {
LAB_001100f7:
                  puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                }
                else if ((char)(byte)*puVar8 < '!') {
                  if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_001100f7;
                  puVar8 = (ulong *)(pbVar10 + 2);
                }
              }
            }
          }
          if (puVar13 == puVar8) goto switchD_0010f960_default;
          local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
          puVar13 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar8,end,(float *)&local_50);
          if ((puVar8 == puVar13) &&
             ((puVar13 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)puVar13,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_2,(float *)&local_50),
              puVar13 == puVar8 || (puVar13 == (ulong *)end)))) goto LAB_001102bf;
          *local_48 = local_50._0_4_;
        }
        else if ((uVar2 & 0xff00000000000000) == 0x7900000000000000) {
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar13 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar10 = (byte *)((long)puVar13 + 2);
                goto LAB_0010ffd8;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar10 = (byte *)((long)puVar13 + 1);
              ctx->unquoted = 0;
LAB_0010ffd8:
              if ((long)end - (long)pbVar10 < 2) {
LAB_00110061:
                pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
              }
              else if ((char)*pbVar10 < '!') {
                if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_00110061;
                pbVar10 = pbVar10 + 1;
              }
              if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
              }
              else {
                puVar8 = (ulong *)(pbVar10 + 1);
                if ((long)end - (long)puVar8 < 2) {
LAB_001101eb:
                  puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                }
                else if ((char)(byte)*puVar8 < '!') {
                  if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_001101eb;
                  puVar8 = (ulong *)(pbVar10 + 2);
                }
              }
            }
          }
          if (puVar13 == puVar8) goto switchD_0010f960_default;
          local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
          puVar13 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar8,end,(float *)&local_50);
          if ((puVar8 == puVar13) &&
             ((puVar13 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)puVar13,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_4,(float *)&local_50),
              puVar13 == puVar8 || (puVar13 == (ulong *)end)))) goto LAB_001102bf;
          local_48[1] = local_50._0_4_;
        }
        else {
          if ((uVar2 & 0xff00000000000000) != 0x7a00000000000000) goto switchD_0010f960_default;
          if (1 < (long)uVar5) {
            bVar1 = *(byte *)((long)puVar13 + 1);
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar10 = (byte *)((long)puVar13 + 2);
                goto LAB_0010ffab;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar10 = (byte *)((long)puVar13 + 1);
              ctx->unquoted = 0;
LAB_0010ffab:
              if ((long)end - (long)pbVar10 < 2) {
LAB_0010fffa:
                pbVar10 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar10,end);
              }
              else if ((char)*pbVar10 < '!') {
                if ((*pbVar10 != 0x20) || ((char)pbVar10[1] < '!')) goto LAB_0010fffa;
                pbVar10 = pbVar10 + 1;
              }
              if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x3a)) {
                puVar8 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar10,end,4);
              }
              else {
                puVar8 = (ulong *)(pbVar10 + 1);
                if ((long)end - (long)puVar8 < 2) {
LAB_00110172:
                  puVar8 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar8,end);
                }
                else if ((char)(byte)*puVar8 < '!') {
                  if (((byte)*puVar8 != 0x20) || ((char)pbVar10[2] < '!')) goto LAB_00110172;
                  puVar8 = (ulong *)(pbVar10 + 2);
                }
              }
            }
          }
          if (puVar13 == puVar8) goto switchD_0010f960_default;
          local_50 = (double)((ulong)local_50 & 0xffffffff00000000);
          puVar13 = (ulong *)flatcc_json_parser_float(ctx,(char *)puVar8,end,(float *)&local_50);
          if ((puVar8 == puVar13) &&
             ((puVar13 = (ulong *)flatcc_json_parser_symbolic_float
                                            (ctx,(char *)puVar13,end,
                                             MyGame_Example_Vec3_parse_json_struct_inline::
                                             symbolic_parsers_3,(float *)&local_50),
              puVar13 == puVar8 || (puVar13 == (ulong *)end)))) goto LAB_001102bf;
          local_48[2] = local_50._0_4_;
        }
      }
      puVar13 = (ulong *)flatcc_json_parser_object_end(ctx,(char *)puVar13,end,&local_3c);
    } while (local_3c != 0);
  }
  else {
    puVar13 = (ulong *)((long)puVar8 + 1);
    if ((long)end - (long)puVar13 < 2) {
LAB_001102a6:
      pcVar4 = flatcc_json_parser_space_ext(ctx,(char *)puVar13,end);
      return pcVar4;
    }
    if ((char)*(byte *)puVar13 < '!') {
      if ((*(byte *)puVar13 != 0x20) || ((char)*(byte *)((long)puVar8 + 2) < '!'))
      goto LAB_001102a6;
      puVar13 = (ulong *)((long)puVar8 + 2);
    }
  }
  return (char *)puVar13;
}

Assistant:

static const char *MyGame_Example_Vec3_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x7465737433000000) { /* branch "test3" */
            if ((w & 0xffffffffff000000) == 0x7465737432000000) { /* "test2" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    int8_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            MyGame_Example_Color_parse_json_enum,
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 24);
                    buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int8_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "test2" */
                if ((w & 0xffffffffff000000) == 0x7465737431000000) { /* "test1" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        double val = 0;
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                monster_test_local_MyGame_Example_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        pval = (void *)((size_t)struct_base + 16);
                        buf = flatcc_json_parser_double(ctx, (mark = buf), end, &val);
                        if (mark == buf) {
                            buf = flatcc_json_parser_symbolic_double(ctx, (mark = buf), end, symbolic_parsers, &val);
                            if (buf == mark || buf == end) goto failed;
                        }
                        flatbuffers_double_write_to_pe(pval, val);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test1" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test1" */
            } /* "test2" */
        } else { /* branch "test3" */
            if (w < 0x7800000000000000) { /* branch "x" */
                if ((w & 0xffffffffff000000) == 0x7465737433000000) { /* "test3" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        pval = (void *)((size_t)struct_base + 26);
                        buf = MyGame_Example_Test_parse_json_struct_inline(ctx, buf, end, pval);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test3" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test3" */
            } else { /* branch "x" */
                if (w < 0x7900000000000000) { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 0);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "x" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "x" */
                } else { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7a00000000000000) { /* "z" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 8);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "z" */
                        if ((w & 0xff00000000000000) == 0x7900000000000000) { /* "y" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                float val = 0;
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        monster_test_local_MyGame_Example_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                pval = (void *)((size_t)struct_base + 4);
                                buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                if (mark == buf) {
                                    buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                    if (buf == mark || buf == end) goto failed;
                                }
                                flatbuffers_float_write_to_pe(pval, val);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "y" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "y" */
                    } /* "z" */
                } /* branch "y" */
            } /* branch "x" */
        } /* branch "test3" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}